

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O3

ASN1_INTEGER * c2i_ASN1_INTEGER(ASN1_INTEGER **a,uchar **pp,long length)

{
  uchar uVar1;
  uchar *puVar2;
  int iVar3;
  ASN1_STRING *str;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  int line;
  int is_negative;
  CBS cbs;
  int local_34;
  CBS local_30;
  
  if (0x3fffffff < (ulong)length) {
    iVar3 = 0xb1;
    line = 0x9b;
LAB_0030307e:
    ERR_put_error(0xc,0,iVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                  ,line);
    return (ASN1_INTEGER *)0x0;
  }
  local_30.data = *pp;
  local_30.len = length;
  iVar3 = CBS_is_valid_asn1_integer(&local_30,&local_34);
  if (iVar3 == 0) {
    iVar3 = 0xc4;
    line = 0xa3;
    goto LAB_0030307e;
  }
  if (((a == (ASN1_INTEGER **)0x0) || (str = *a, str == (ASN1_STRING *)0x0)) &&
     (str = ASN1_INTEGER_new(), str == (ASN1_INTEGER *)0x0)) {
    return (ASN1_INTEGER *)0x0;
  }
  if (local_34 == 0) {
    if ((local_30.len != 0) && (*local_30.data == '\0')) goto LAB_003030a1;
  }
  else if ((local_30.len != 0) && ((*local_30.data == 0xff && (local_30.len != 1)))) {
    if (local_30.data[1] == '\0') {
      uVar4 = 1;
      do {
        uVar5 = uVar4;
        if (uVar5 + (2 - local_30.len) == 1) break;
        uVar4 = uVar5 + 1;
      } while (local_30.data[uVar5 + 1] == '\0');
      if (local_30.len - 1 <= uVar5) goto LAB_003030b0;
    }
LAB_003030a1:
    CBS_skip(&local_30,1);
  }
LAB_003030b0:
  iVar3 = ASN1_STRING_set(str,local_30.data,(int)local_30.len);
  if (iVar3 == 0) {
    if ((a == (ASN1_INTEGER **)0x0) || (*a != str)) {
      ASN1_INTEGER_free(str);
    }
    return (ASN1_INTEGER *)0x0;
  }
  if (local_34 == 0) {
    str->type = 2;
LAB_0030312b:
    if (str->length != 0) {
      if (*str->data == '\0') {
        __assert_fail("ret->length == 0 || ret->data[0] != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                      ,0xcf,
                      "ASN1_INTEGER *c2i_ASN1_INTEGER(ASN1_INTEGER **, const unsigned char **, long)"
                     );
      }
      if (0 < str->length) goto LAB_00303145;
    }
  }
  else {
    str->type = 0x102;
    uVar4 = (ulong)str->length;
    if (uVar4 != 0) {
      puVar2 = str->data;
      uVar5 = uVar4 - 1;
      bVar6 = 0;
      do {
        uVar1 = puVar2[uVar5];
        puVar2[uVar5] = -(bVar6 + uVar1);
        bVar6 = uVar1 != '\0' | bVar6;
        uVar5 = uVar5 - 1;
      } while (uVar5 < uVar4);
      goto LAB_0030312b;
    }
  }
  if (local_34 != 0) {
    __assert_fail("!is_negative || ret->length > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                  ,0xd1,
                  "ASN1_INTEGER *c2i_ASN1_INTEGER(ASN1_INTEGER **, const unsigned char **, long)");
  }
LAB_00303145:
  *pp = *pp + length;
  if (a != (ASN1_INTEGER **)0x0) {
    *a = str;
    return str;
  }
  return str;
}

Assistant:

ASN1_INTEGER *c2i_ASN1_INTEGER(ASN1_INTEGER **out, const unsigned char **inp,
                               long len) {
  // This function can handle lengths up to INT_MAX - 1, but the rest of the
  // legacy ASN.1 code mixes integer types, so avoid exposing it to
  // ASN1_INTEGERS with larger lengths.
  if (len < 0 || len > INT_MAX / 2) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_TOO_LONG);
    return NULL;
  }

  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  int is_negative;
  if (!CBS_is_valid_asn1_integer(&cbs, &is_negative)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_INTEGER);
    return NULL;
  }

  ASN1_INTEGER *ret = NULL;
  if (out == NULL || *out == NULL) {
    ret = ASN1_INTEGER_new();
    if (ret == NULL) {
      return NULL;
    }
  } else {
    ret = *out;
  }

  // Convert to |ASN1_INTEGER|'s sign-and-magnitude representation. First,
  // determine the size needed for a minimal result.
  if (is_negative) {
    // 0xff00...01 through 0xff7f..ff have a two's complement of 0x00ff...ff
    // through 0x000100...001 and need one leading zero removed. 0x8000...00
    // through 0xff00...00 have a two's complement of 0x8000...00 through
    // 0x0100...00 and will be minimally-encoded as-is.
    if (CBS_len(&cbs) > 0 && CBS_data(&cbs)[0] == 0xff &&
        !is_all_zeros(CBS_data(&cbs) + 1, CBS_len(&cbs) - 1)) {
      CBS_skip(&cbs, 1);
    }
  } else {
    // Remove the leading zero byte, if any.
    if (CBS_len(&cbs) > 0 && CBS_data(&cbs)[0] == 0x00) {
      CBS_skip(&cbs, 1);
    }
  }

  if (!ASN1_STRING_set(ret, CBS_data(&cbs), CBS_len(&cbs))) {
    goto err;
  }

  if (is_negative) {
    ret->type = V_ASN1_NEG_INTEGER;
    negate_twos_complement(ret->data, ret->length);
  } else {
    ret->type = V_ASN1_INTEGER;
  }

  // The value should be minimally-encoded.
  assert(ret->length == 0 || ret->data[0] != 0);
  // Zero is not negative.
  assert(!is_negative || ret->length > 0);

  *inp += len;
  if (out != NULL) {
    *out = ret;
  }
  return ret;

err:
  if (ret != NULL && (out == NULL || *out != ret)) {
    ASN1_INTEGER_free(ret);
  }
  return NULL;
}